

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

void ELFIO::dump::dynamic_tag
               (ostream *out,Elf_Xword no,Elf_Xword tag,Elf_Xword value,string *str,uint param_6)

{
  Elf_Xword EVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  ostream *poVar4;
  void *pvVar5;
  ulong uVar6;
  string local_68;
  char local_41;
  int local_40;
  char local_39;
  int local_38;
  uint local_34;
  string *psStack_30;
  uint param_5_local;
  string *str_local;
  Elf_Xword value_local;
  Elf_Xword tag_local;
  Elf_Xword no_local;
  ostream *out_local;
  
  local_34 = param_6;
  psStack_30 = str;
  str_local = (string *)value;
  value_local = tag;
  tag_local = no;
  no_local = (Elf_Xword)out;
  poVar4 = std::operator<<(out,"[");
  local_38 = (int)std::setw(5);
  poVar4 = std::operator<<(poVar4,(_Setw)local_38);
  local_39 = (char)std::setfill<char>(' ');
  poVar4 = std::operator<<(poVar4,local_39);
  pvVar5 = (void *)std::ostream::operator<<(poVar4,std::dec);
  pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::right);
  poVar4 = (ostream *)std::ostream::operator<<(pvVar5,tag_local);
  poVar4 = std::operator<<(poVar4,"] ");
  local_40 = (int)std::setw(0x10);
  poVar4 = std::operator<<(poVar4,(_Setw)local_40);
  local_41 = (char)std::setfill<char>(' ');
  poVar4 = std::operator<<(poVar4,local_41);
  pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
  poVar4 = (ostream *)std::ostream::operator<<(pvVar5,std::left);
  str_dynamic_tag<unsigned_long>(&local_68,value_local);
  poVar4 = std::operator<<(poVar4,(string *)&local_68);
  std::operator<<(poVar4," ");
  std::__cxx11::string::~string((string *)&local_68);
  uVar6 = std::__cxx11::string::empty();
  EVar1 = no_local;
  if ((uVar6 & 1) == 0) {
    _Var3 = std::setw(0x20);
    poVar4 = std::operator<<((ostream *)EVar1,_Var3);
    _Var2 = std::setfill<char>(' ');
    poVar4 = std::operator<<(poVar4,_Var2._M_c);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar5,std::left);
    poVar4 = std::operator<<(poVar4,(string *)psStack_30);
    std::operator<<(poVar4," ");
  }
  else {
    poVar4 = std::operator<<((ostream *)no_local,"0x");
    _Var3 = std::setw(0x10);
    poVar4 = std::operator<<(poVar4,_Var3);
    _Var2 = std::setfill<char>('0');
    poVar4 = std::operator<<(poVar4,_Var2._M_c);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
    pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::right);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar5,(ulong)str_local);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<((void *)no_local,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void dynamic_tag( std::ostream&      out,
                             Elf_Xword          no,
                             Elf_Xword          tag,
                             Elf_Xword          value,
                             const std::string& str,
                             unsigned int /*elf_class*/ )
    {
        out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
            << DUMP_STR_FORMAT( 16 ) << str_dynamic_tag( tag ) << " ";
        if ( str.empty() ) {
            out << DUMP_HEX0x_FORMAT( 16 ) << value << " ";
        }
        else {
            out << DUMP_STR_FORMAT( 32 ) << str << " ";
        }
        out << std::endl;
    }